

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnUUID::ColumnUUID(ColumnUUID *this,ColumnRef *data)

{
  uint uVar1;
  element_type *peVar2;
  runtime_error *this_00;
  Column *in_RSI;
  undefined8 *in_RDI;
  TypeRef *in_stack_ffffffffffffffa8;
  Column *in_stack_ffffffffffffffb0;
  
  Type::CreateUUID();
  Column::Column(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x23ba97);
  *in_RDI = &PTR__ColumnUUID_002a0850;
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x23babd);
  Column::As<clickhouse::ColumnVector<unsigned_long>>(in_RSI);
  peVar2 = std::
           __shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_long>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23bada);
  uVar1 = (*(peVar2->super_Column)._vptr_Column[6])();
  if ((uVar1 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"number of entries must be even (two 64-bit numbers for each UUID)");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

ColumnUUID::ColumnUUID(ColumnRef data)
    : Column(Type::CreateUUID())
    , data_(data->As<ColumnUInt64>())
{
    if (data_->Size() % 2 != 0) {
        throw std::runtime_error("number of entries must be even (two 64-bit numbers for each UUID)");
    }
}